

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O2

unsigned_long_long __thiscall
CyclicHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  CyclicHash<unsigned_long_long,unsigned_char> CVar1;
  ulong uVar2;
  uint uVar3;
  size_type sVar4;
  byte *pbVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar3 = 0;
  while( true ) {
    sVar4 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(c);
    if (sVar4 <= uVar3) break;
    uVar2 = *(ulong *)(this + 0x810);
    CVar1 = this[0xc];
    pbVar5 = std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::operator[]
                       (&(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Deque_impl_data._M_start,(ulong)uVar3);
    uVar6 = (uVar6 >> ((char)CVar1 - 1U & 0x3f) | (uVar2 & uVar6) * 2) ^
            *(ulong *)(this + (ulong)*pbVar5 * 8 + 0x10);
    uVar3 = uVar3 + 1;
  }
  return uVar6;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }